

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agate.cpp
# Opt level: O0

void do_delete_class_proc(Am_Object *param_1)

{
  byte bVar1;
  Am_Value *pAVar2;
  Am_Object local_50;
  Am_Value_List local_48 [8];
  Am_Value_List l;
  Am_String local_38 [3];
  Am_String local_20;
  Am_String class_name;
  Am_Object cls;
  Am_Object *param_0_local;
  
  pAVar2 = (Am_Value *)Am_Object::Get(0x5510,0x169);
  Am_Object::Am_Object((Am_Object *)&class_name,pAVar2);
  pAVar2 = (Am_Value *)Am_Object::Get((ushort)(Am_Object *)&class_name,(ulong)(ushort)CLASS_NAME);
  Am_String::Am_String(&local_20,pAVar2);
  Am_String::Am_String(local_38,(Am_String *)&local_20);
  Am_Gesture_Trainer::Delete_Class((Am_String *)&trainer,SUB81(local_38,0));
  Am_String::~Am_String(local_38);
  pAVar2 = (Am_Value *)Am_Object::Get(0x5510,0xa2);
  Am_Value_List::Am_Value_List(local_48,pAVar2);
  Am_Value_List::Start();
  while (bVar1 = Am_Value_List::Last(), ((bVar1 ^ 0xff) & 1) != 0) {
    pAVar2 = (Am_Value *)Am_Value_List::Get();
    Am_Object::Am_Object(&local_50,pAVar2);
    bVar1 = Am_Object::operator==(&local_50,(Am_Object *)&class_name);
    Am_Object::~Am_Object(&local_50);
    if ((bVar1 & 1) != 0) {
      Am_Value_List::Delete(SUB81(local_48,0));
    }
    Am_Value_List::Next();
  }
  Am_Object::Note_Changed(0x5510);
  Am_Object::Set(0x5510,0x169,0);
  Am_Object::Set(0x5560,(Am_String *)0x169,0x115570);
  dirty = true;
  Am_Value_List::~Am_Value_List(local_48);
  Am_String::~Am_String(&local_20);
  Am_Object::~Am_Object((Am_Object *)&class_name);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, do_delete_class, (Am_Object /*cmd*/))
{
  Am_Object cls = class_panel.Get(Am_VALUE);
  Am_String class_name = cls.Get(CLASS_NAME);

  trainer.Delete_Class(class_name);

  Am_Value_List l = class_panel.Get(Am_ITEMS);
  for (l.Start(); !l.Last(); l.Next())
    if (Am_Object(l.Get()) == cls)
      l.Delete(false);
  class_panel.Note_Changed(Am_ITEMS);

  class_panel.Set(Am_VALUE, 0);

  mode.Set(Am_VALUE, training_mode);

  // the classifier has changed, so set dirty flag
  dirty = true;
}